

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O2

void __thiscall Program::show_list(Program *this)

{
  int lineNumber;
  Program *pPVar1;
  ostream *poVar2;
  string sStack_48;
  
  pPVar1 = (Program *)
           ((this->list_of_program)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
  if ((this->list_of_program)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pPVar1 = this;
  }
  for (lineNumber = pPVar1->end_line; lineNumber != this->end_line;
      lineNumber = getNextLineNumber(this,lineNumber)) {
    getSourceLine_abi_cxx11_(&sStack_48,this,lineNumber);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&sStack_48);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return;
}

Assistant:

void Program::show_list() {
    int num = getFirstLineNumber();
    while (num != end_line) {
        cout << getSourceLine(num) << '\n';
        num = getNextLineNumber(num);
    }
}